

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O1

void Set_XCursor(int x,int y)

{
  MXCURSOR *pMVar1;
  long lVar2;
  MXCURSOR **ppMVar3;
  MXCURSOR *pMVar4;
  DLword *bitmap;
  
  bitmap = IOPage->dlcursorbitmap;
  ppMVar3 = &cursorlist;
  pMVar1 = (MXCURSOR *)0x0;
LAB_0013ff1b:
  pMVar4 = pMVar1;
  ppMVar3 = &((MXCURSOR *)ppMVar3)->next->next;
  if ((MXCURSOR *)ppMVar3 != (MXCURSOR *)0x0) goto code_r0x0013ff26;
  ppMVar3 = (MXCURSOR **)malloc(0x30);
  lVar2 = 0;
  do {
    ((MXCURSOR *)ppMVar3)->bitmap[lVar2] = bitmap[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  set_Xcursor(currentdsp,(uint8_t *)bitmap,x,0xf - y,&((MXCURSOR *)ppMVar3)->Xid,1);
  goto LAB_0013ffa7;
code_r0x0013ff26:
  lVar2 = 0;
  do {
    if (((MXCURSOR *)ppMVar3)->bitmap[lVar2] != bitmap[lVar2]) goto LAB_0013ff43;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0x10;
LAB_0013ff43:
  pMVar1 = (MXCURSOR *)ppMVar3;
  if ((int)lVar2 == 0x10) {
    if ((MXCURSOR *)ppMVar3 != cursorlist) {
      pMVar4->next = ((MXCURSOR *)ppMVar3)->next;
LAB_0013ffa7:
      ((MXCURSOR *)ppMVar3)->next = cursorlist;
      cursorlist = (MXCURSOR *)ppMVar3;
    }
    XDefineCursor(currentdsp->display_id,currentdsp->DisplayWindow,((MXCURSOR *)ppMVar3)->Xid);
    Current_Hot_X = x;
    Current_Hot_Y = 0xf - y;
    return;
  }
  goto LAB_0013ff1b;
}

Assistant:

void Set_XCursor(int x, int y)
{
  /* compare cursor in IOPage memory with cursors we've seen before */
  struct MXCURSOR *clp, *clbp = NULL;
  DLword *newbm = ((DLword *)(IOPage->dlcursorbitmap));
  int i;

  XLOCK; /* No signals while setting the cursor */
  for (clp = cursorlist; clp != NULL; clbp = clp, clp = clp->next) {
    for (i = 0; i < CURSORHEIGHT; i++)
      if (clp->bitmap[i] != newbm[i]) break;
    if (i == CURSORHEIGHT) break;
  }

  if (clp == NULL) { /* it isn't there, push on a new one */
    clp = (struct MXCURSOR *)malloc(sizeof(struct MXCURSOR));
    /* and fill it up with the current new cursor */
    for (i = 0; i < CURSORHEIGHT; i++) clp->bitmap[i] = newbm[i];
#ifdef NEWXCURSOR
    /* JDS 000521 Added "15-" to fix cursor troubles at window edge */
    set_Xcursor(currentdsp, (uint8_t *)newbm, x, 15 - y, &(clp->Xid), 1);
#else
    set_Xcursor(currentdsp, (uint8_t *)newbm, 0, 0, &(clp->Xid), 1);
#endif /* NEWXCURSOR */
    clp->next = cursorlist;
    cursorlist = clp;
  } else
      /* found it, move it to the front of the list
         (this should reduce search time on the average by keeping
         the popular cursors near the front of the list)
         */
      if (clp != cursorlist) { /* don't move if it's already there */
    clbp->next = clp->next;
    clp->next = cursorlist;
    cursorlist = clp;
  }
  DefineCursor(currentdsp, currentdsp->DisplayWindow, &(clp->Xid));
  XUNLOCK(currentdsp); /* Signals OK now */

#ifdef NEWXCURSOR
  /* Save the hotspot for later position reporting/setting */

  Current_Hot_X = x;
  Current_Hot_Y = 15 - y; /* Added 15- to fix window-edge trouble */
#endif                    /* NEWXCURSOR */

}